

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

Aig_Man_t *
Aig_ManRegCreatePart
          (Aig_Man_t *pAig,Vec_Int_t *vPart,int *pnCountPis,int *pnCountRegs,int **ppMapBack)

{
  int iVar1;
  Aig_Obj_t **ppNodes;
  void **ppvVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint *__ptr;
  void *pvVar6;
  Vec_Ptr_t *__ptr_00;
  Aig_Man_t *p;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pAVar8;
  int *piVar9;
  ulong uVar10;
  Aig_Obj_t *p1;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  size_t __size;
  
  uVar4 = vPart->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar4 - 1) {
    uVar12 = uVar4;
  }
  __ptr[1] = 0;
  *__ptr = uVar12;
  if (uVar12 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar12 << 3);
  }
  *(void **)(__ptr + 2) = pvVar6;
  if (0 < vPart->nSize) {
    iVar1 = pAig->nObjs[3];
    iVar5 = pAig->nRegs;
    lVar14 = 0;
    do {
      uVar4 = vPart->pArray[lVar14] + (iVar1 - iVar5);
      if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_006c0bff;
      uVar10 = *(ulong *)((long)pAig->vCos->pArray[uVar4] + 8);
      uVar4 = __ptr[1];
      uVar12 = *__ptr;
      if (uVar4 == uVar12) {
        if ((int)uVar12 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar15 = 0x10;
        }
        else {
          uVar15 = uVar12 * 2;
          if ((int)uVar15 <= (int)uVar12) goto LAB_006c07e0;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc((ulong)uVar12 << 4);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar12 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar6;
        *__ptr = uVar15;
      }
LAB_006c07e0:
      __ptr[1] = uVar4 + 1;
      *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar4 * 8) = uVar10 & 0xfffffffffffffffe;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vPart->nSize);
  }
  ppNodes = *(Aig_Obj_t ***)(__ptr + 2);
  __ptr_00 = Aig_ManDfsNodes(pAig,ppNodes,__ptr[1]);
  if (ppNodes != (Aig_Obj_t **)0x0) {
    free(ppNodes);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  uVar4 = pAig->nRegs;
  iVar1 = vPart->nSize;
  if (0 < (long)iVar1) {
    iVar5 = pAig->nObjs[2];
    piVar9 = vPart->pArray;
    pVVar7 = pAig->vCis;
    lVar14 = 0;
    do {
      uVar12 = piVar9[lVar14] + (iVar5 - uVar4);
      if (((int)uVar12 < 0) || (pVVar7->nSize <= (int)uVar12)) goto LAB_006c0bff;
      *(int *)((long)pVVar7->pArray[uVar12] + 0x20) = pAig->nTravIds + -1;
      lVar14 = lVar14 + 1;
    } while (iVar1 != lVar14);
  }
  iVar1 = pAig->nObjs[2];
  iVar5 = 0;
  iVar11 = 0;
  uVar12 = iVar1 - uVar4;
  uVar10 = (ulong)uVar12;
  if (uVar12 != 0 && (int)uVar4 <= iVar1) {
    uVar15 = pAig->vCis->nSize;
    uVar13 = 0;
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    iVar11 = 0;
    do {
      if (uVar15 <= iVar1 + ~uVar4) goto LAB_006c0bff;
      iVar11 = iVar11 + (uint)(*(int *)((long)pAig->vCis->pArray[uVar13] + 0x20) == pAig->nTravIds);
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  iVar1 = pAig->vCis->nSize;
  if ((int)uVar12 < iVar1) {
    iVar5 = 0;
    do {
      if ((int)uVar12 < 0) goto LAB_006c0bff;
      iVar5 = iVar5 + (uint)(*(int *)((long)pAig->vCis->pArray[uVar10] + 0x20) == pAig->nTravIds);
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < iVar1);
  }
  if (pnCountPis != (int *)0x0) {
    *pnCountPis = iVar11;
  }
  if (pnCountRegs != (int *)0x0) {
    *pnCountRegs = iVar5;
  }
  p = Aig_ManStart(__ptr_00->nSize);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar7 = pAig->vCis;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      pvVar6 = pVVar7->pArray[lVar14];
      if (*(int *)((long)pvVar6 + 0x20) == pAig->nTravIds) {
        pAVar8 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar8;
      }
      lVar14 = lVar14 + 1;
      pVVar7 = pAig->vCis;
    } while (lVar14 < pVVar7->nSize);
  }
  if (0 < vPart->nSize) {
    iVar1 = pAig->nObjs[2];
    iVar5 = pAig->nRegs;
    lVar14 = 0;
    do {
      uVar4 = vPart->pArray[lVar14] + (iVar1 - iVar5);
      if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_006c0bff;
      pvVar6 = pAig->vCis->pArray[uVar4];
      pAVar8 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar8;
      Aig_ObjCreateCo(p,pAVar8);
      *(int *)((long)pvVar6 + 0x20) = pAig->nTravIds;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vPart->nSize);
  }
  if (0 < __ptr_00->nSize) {
    lVar14 = 0;
    do {
      pvVar6 = __ptr_00->pArray[lVar14];
      if (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7) {
        if (((ulong)pvVar6 & 1) != 0) goto LAB_006c0c1e;
        uVar10 = *(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar6 + 8) & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        uVar10 = *(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar6 + 0x10) & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        pAVar8 = Aig_And(p,pAVar8,p1);
        *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar8;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < __ptr_00->nSize);
  }
  uVar4 = vPart->nSize;
  if (0 < (int)uVar4) {
    iVar1 = pAig->nObjs[3];
    iVar5 = pAig->nRegs;
    lVar14 = 0;
    do {
      uVar4 = vPart->pArray[lVar14] + (iVar1 - iVar5);
      if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_006c0bff;
      pvVar6 = pAig->vCos->pArray[uVar4];
      if (((ulong)pvVar6 & 1) != 0) {
LAB_006c0c1e:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar10 = *(ulong *)((long)pvVar6 + 8);
      uVar13 = uVar10 & 0xfffffffffffffffe;
      if (uVar13 == 0) {
        pAVar8 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar10 & 1) ^ *(ulong *)(uVar13 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar8);
      lVar14 = lVar14 + 1;
      uVar4 = vPart->nSize;
    } while (lVar14 < (int)uVar4);
  }
  p->nRegs = uVar4;
  if (ppMapBack != (int **)0x0) {
    __size = (long)p->vObjs->nSize << 2;
    piVar9 = (int *)malloc(__size);
    memset(piVar9,0xff,__size);
    *piVar9 = 0;
    if (0 < __ptr_00->nSize) {
      ppvVar2 = __ptr_00->pArray;
      lVar14 = 0;
      do {
        piVar9[*(int *)((*(ulong *)((long)ppvVar2[lVar14] + 0x28) & 0xfffffffffffffffe) + 0x24)] =
             *(int *)((long)ppvVar2[lVar14] + 0x24);
        lVar14 = lVar14 + 1;
      } while (lVar14 < __ptr_00->nSize);
    }
    if (0 < (int)uVar4) {
      iVar1 = pAig->nObjs[2];
      iVar5 = pAig->nRegs;
      piVar3 = vPart->pArray;
      pVVar7 = pAig->vCis;
      uVar10 = 0;
      do {
        uVar12 = piVar3[uVar10] + (iVar1 - iVar5);
        if (((int)uVar12 < 0) || (pVVar7->nSize <= (int)uVar12)) {
LAB_006c0bff:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar6 = pVVar7->pArray[uVar12];
        piVar9[*(int *)(*(long *)((long)pvVar6 + 0x28) + 0x24)] = *(int *)((long)pvVar6 + 0x24);
        uVar10 = uVar10 + 1;
      } while (uVar4 != uVar10);
    }
    *ppMapBack = piVar9;
  }
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (void **)0x0;
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    free(__ptr_00);
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManRegCreatePart( Aig_Man_t * pAig, Vec_Int_t * vPart, int * pnCountPis, int * pnCountRegs, int ** ppMapBack )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vRoots;
    int nOffset, iOut, i;
    int nCountPis, nCountRegs;
    int * pMapBack;
    // collect roots
    vRoots = Vec_PtrAlloc( Vec_IntSize(vPart) );
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo(pAig, nOffset+iOut);
        Vec_PtrPush( vRoots, Aig_ObjFanin0(pObj) );
    }
    // collect/mark nodes/PIs in the DFS order
    vNodes = Aig_ManDfsNodes( pAig, (Aig_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );
    Vec_PtrFree( vRoots );
    // unmark register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        Aig_ObjSetTravIdPrevious( pAig, pObj );
    }
    // count pure PIs
    nCountPis = nCountRegs = 0;
    Aig_ManForEachPiSeq( pAig, pObj, i )
        nCountPis += Aig_ObjIsTravIdCurrent(pAig, pObj);
    // count outputs of other registers
    Aig_ManForEachLoSeq( pAig, pObj, i )
        nCountRegs += Aig_ObjIsTravIdCurrent(pAig, pObj); 
    if ( pnCountPis )
        *pnCountPis = nCountPis;
    if ( pnCountRegs )
        *pnCountRegs = nCountRegs;
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    Aig_ManConst1(pAig)->pData = Aig_ManConst1(pNew);
    // create the PIs
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    // add variables for the register outputs
    // create fake POs to hold the register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        pObj->pData = Aig_ObjCreateCi(pNew);
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
        Aig_ObjSetTravIdCurrent( pAig, pObj ); // added
    }
    // create the nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And(pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add real POs for the registers
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo( pAig, nOffset+iOut );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    pNew->nRegs = Vec_IntSize(vPart);
    // create map
    if ( ppMapBack )
    {
        pMapBack = ABC_ALLOC( int, Aig_ManObjNumMax(pNew) );
        memset( pMapBack, 0xff, sizeof(int) * Aig_ManObjNumMax(pNew) );
        // map constant nodes
        pMapBack[0] = 0;
        // logic cones of register outputs
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Aig_Regular((Aig_Obj_t *)pObj->pData);
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        // map register outputs
        nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
        Vec_IntForEachEntry( vPart, iOut, i )
        {
            pObj = Aig_ManCi(pAig, nOffset+iOut);
            pObjNew = (Aig_Obj_t *)pObj->pData;
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        *ppMapBack = pMapBack;
    }
    Vec_PtrFree( vNodes );
    return pNew;
}